

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select_iterrupter.cpp
# Opt level: O0

void booster::aio::impl::anon_unknown_1::check(native_type t)

{
  undefined8 uVar1;
  int in_EDI;
  system_error *unaff_retaddr;
  int ec;
  error_category *in_stack_fffffffffffffff0;
  
  if (in_EDI == -1) {
    __errno_location();
    uVar1 = __cxa_allocate_exception(0x40);
    system::system_error::system_error(unaff_retaddr,in_EDI,in_stack_fffffffffffffff0);
    __cxa_throw(uVar1,&system::system_error::typeinfo,system::system_error::~system_error);
  }
  return;
}

Assistant:

void check(native_type t)
		{
			if(t==invalid_socket) {
				#ifdef BOOSTER_WIN32
				int ec = WSAGetLastError();
				#else
				int ec=errno;
				#endif
				throw system::system_error(ec,syscat);
			}
		}